

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.h
# Opt level: O0

void __thiscall HDD::~HDD(HDD *this)

{
  code *pcVar1;
  HDD *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~HDD() { Unlock(); if (h != -1) close(h); Reset(); }